

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigUtil.c
# Opt level: O1

int Fraig_NodeSimsContained(Fraig_Man_t *pMan,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2)

{
  long lVar1;
  
  if (0 < (long)pMan->nWordsRand) {
    lVar1 = 0;
    do {
      if ((pNode1->puSimR[lVar1] & ~pNode2->puSimR[lVar1]) != 0) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (pMan->nWordsRand != lVar1);
  }
  if (0 < (long)pMan->iWordStart) {
    lVar1 = 0;
    do {
      if ((pNode1->puSimD[lVar1] & ~pNode2->puSimD[lVar1]) != 0) {
        return 0;
      }
      lVar1 = lVar1 + 1;
    } while (pMan->iWordStart != lVar1);
  }
  return 1;
}

Assistant:

int Fraig_NodeSimsContained( Fraig_Man_t * pMan, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2 )
{
    unsigned * pUnsigned1, * pUnsigned2;
    int i;

    // compare random siminfo
    pUnsigned1 = pNode1->puSimR;
    pUnsigned2 = pNode2->puSimR;
    for ( i = 0; i < pMan->nWordsRand; i++ )
        if ( pUnsigned1[i] & ~pUnsigned2[i] )
            return 0;

    // compare systematic siminfo
    pUnsigned1 = pNode1->puSimD;
    pUnsigned2 = pNode2->puSimD;
    for ( i = 0; i < pMan->iWordStart; i++ )
        if ( pUnsigned1[i] & ~pUnsigned2[i] )
            return 0;

    return 1;
}